

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O2

void __thiscall
BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
          (BayesianGameForDecPOMDPStage *this,PlanningUnitDecPOMDPDiscrete *pu,
          QFunctionJAOHInterface *q,Index t,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes)

{
  size_t __n;
  allocator_type local_31;
  
  BayesianGameForDecPOMDPStageInterface::BayesianGameForDecPOMDPStageInterface
            (&this->super_BayesianGameForDecPOMDPStageInterface,t);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (&this->super_BayesianGameIdenticalPayoff,nrAgents,nrActions,nrTypes,false);
  (this->super_BayesianGameForDecPOMDPStageInterface)._vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005d8458;
  (this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005d84a8;
  this->_m_pu = pu;
  this->_m_qHeuristic = q;
  __n = BayesianGameBase::GetNrJointTypes
                  ((BayesianGameBase *)&this->super_BayesianGameIdenticalPayoff);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            (&this->_m_JBs,__n,&local_31);
  this->_m_areCachedImmediateRewards = false;
  (this->_m_immR).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_immR).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_immR).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage(
        const PlanningUnitDecPOMDPDiscrete* pu,
        const QFunctionJAOHInterface* q,
        Index t,
        size_t nrAgents,
        const vector<size_t>& nrActions,
        const vector<size_t>& nrTypes
        
    )
        :
            BayesianGameForDecPOMDPStageInterface(t)
            //,BayesianGameBase( nrAgents, nrActions, nrTypes )
            ,BayesianGameIdenticalPayoff( nrAgents, nrActions, nrTypes )
            ,_m_pu(pu)
            ,_m_qHeuristic(q)
            ,_m_JBs( GetNrJointTypes() )
            ,_m_areCachedImmediateRewards(false)
{
    //here we do NOT do any extra stuff! The derived class (that called this 
    //protected constructor) is responsible for filling 
    //-the utilities
    //-the probabilities
    //-_m_JBs
    //-...etc.
}